

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O1

void __thiscall
duckdb::AttachOptions::AttachOptions
          (AttachOptions *this,
          unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *info,
          AccessMode default_access_mode)

{
  key_type *__k;
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  mapped_type *this_00;
  string *input;
  _Hash_node_base *p_Var4;
  Value *this_01;
  AccessMode AVar5;
  undefined1 local_e8 [24];
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Alloc_hider local_90;
  char local_80 [16];
  Value local_70;
  
  this->access_mode = default_access_mode;
  (this->db_type)._M_dataplus._M_p = (pointer)&(this->db_type).field_2;
  (this->db_type)._M_string_length = 0;
  (this->db_type).field_2._M_local_buf[0] = '\0';
  (this->options)._M_h._M_buckets = &(this->options)._M_h._M_single_bucket;
  (this->options)._M_h._M_bucket_count = 1;
  (this->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options)._M_h._M_element_count = 0;
  (this->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->default_table).catalog._M_dataplus._M_p = (pointer)&(this->default_table).catalog.field_2;
  (this->default_table).catalog._M_string_length = 0;
  (this->default_table).catalog.field_2._M_local_buf[0] = '\0';
  (this->default_table).schema._M_dataplus._M_p = (pointer)&(this->default_table).schema.field_2;
  (this->default_table).schema._M_string_length = 0;
  (this->default_table).schema.field_2._M_local_buf[0] = '\0';
  (this->default_table).name._M_dataplus._M_p = (pointer)&(this->default_table).name.field_2;
  (this->default_table).name._M_string_length = 0;
  (this->default_table).name.field_2._M_local_buf[0] = '\0';
  pAVar3 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  p_Var4 = (pAVar3->options)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      __k = (key_type *)(p_Var4 + 1);
      iVar2 = ::std::__cxx11::string::compare((char *)__k);
      if ((iVar2 == 0) || (iVar2 = ::std::__cxx11::string::compare((char *)__k), iVar2 == 0)) {
        LogicalType::LogicalType(&local_70.type_,BOOLEAN);
        Value::DefaultCastAs((Value *)local_d0,(Value *)(p_Var4 + 5),&local_70.type_,false);
        bVar1 = BooleanValue::Get((Value *)local_d0);
        Value::~Value((Value *)local_d0);
        LogicalType::~LogicalType(&local_70.type_);
        AVar5 = bVar1 ^ READ_WRITE;
LAB_0166bcc2:
        this->access_mode = AVar5;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)__k);
        if ((iVar2 == 0) || (iVar2 = ::std::__cxx11::string::compare((char *)__k), iVar2 == 0)) {
          LogicalType::LogicalType(&local_70.type_,BOOLEAN);
          Value::DefaultCastAs((Value *)local_d0,(Value *)(p_Var4 + 5),&local_70.type_,false);
          bVar1 = BooleanValue::Get((Value *)local_d0);
          Value::~Value((Value *)local_d0);
          LogicalType::~LogicalType(&local_70.type_);
          AVar5 = bVar1 | READ_ONLY;
          goto LAB_0166bcc2;
        }
        iVar2 = ::std::__cxx11::string::compare((char *)__k);
        if (iVar2 == 0) {
          LogicalType::LogicalType(&local_70.type_,VARCHAR);
          Value::DefaultCastAs((Value *)local_d0,(Value *)(p_Var4 + 5),&local_70.type_,false);
          StringValue::Get_abi_cxx11_((Value *)local_d0);
          ::std::__cxx11::string::_M_assign((string *)&this->db_type);
          Value::~Value((Value *)local_d0);
          this_01 = &local_70;
LAB_0166bdcc:
          LogicalType::~LogicalType(&this_01->type_);
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar2 == 0) {
            LogicalType::LogicalType((LogicalType *)local_e8,VARCHAR);
            Value::DefaultCastAs(&local_70,(Value *)(p_Var4 + 5),(LogicalType *)local_e8,false);
            input = StringValue::Get_abi_cxx11_(&local_70);
            QualifiedName::Parse((QualifiedName *)local_d0,input);
            ::std::__cxx11::string::operator=((string *)&this->default_table,(string *)local_d0);
            ::std::__cxx11::string::operator=
                      ((string *)&(this->default_table).schema,(string *)&local_b0);
            ::std::__cxx11::string::operator=
                      ((string *)&(this->default_table).name,(string *)&local_90);
            if (local_90._M_p != local_80) {
              operator_delete(local_90._M_p);
            }
            if (local_b0._M_p != local_a0) {
              operator_delete(local_b0._M_p);
            }
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_);
            }
            Value::~Value(&local_70);
            this_01 = (Value *)local_e8;
            goto LAB_0166bdcc;
          }
          this_00 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->options,__k);
          Value::operator=(this_00,(Value *)(p_Var4 + 5));
        }
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

AttachOptions::AttachOptions(const unique_ptr<AttachInfo> &info, const AccessMode default_access_mode)
    : access_mode(default_access_mode) {

	for (auto &entry : info->options) {
		if (entry.first == "readonly" || entry.first == "read_only") {
			// Extract the read access mode.

			auto read_only = BooleanValue::Get(entry.second.DefaultCastAs(LogicalType::BOOLEAN));
			if (read_only) {
				access_mode = AccessMode::READ_ONLY;
			} else {
				access_mode = AccessMode::READ_WRITE;
			}
			continue;
		}

		if (entry.first == "readwrite" || entry.first == "read_write") {
			// Extract the write access mode.
			auto read_write = BooleanValue::Get(entry.second.DefaultCastAs(LogicalType::BOOLEAN));
			if (!read_write) {
				access_mode = AccessMode::READ_ONLY;
			} else {
				access_mode = AccessMode::READ_WRITE;
			}
			continue;
		}

		if (entry.first == "type") {
			// Extract the database type.
			db_type = StringValue::Get(entry.second.DefaultCastAs(LogicalType::VARCHAR));
			continue;
		}

		if (entry.first == "default_table") {
			default_table = QualifiedName::Parse(StringValue::Get(entry.second.DefaultCastAs(LogicalType::VARCHAR)));
			continue;
		}

		options[entry.first] = entry.second;
	}
}